

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

void __thiscall ImPlotInputMap::ImPlotInputMap(ImPlotInputMap *this)

{
  this->PanButton = 0;
  this->PanMod = 0;
  this->FitButton = 0;
  this->ContextMenuButton = 1;
  this->BoxSelectButton = 1;
  this->BoxSelectMod = 0;
  this->BoxSelectCancelButton = 0;
  this->QueryButton = 2;
  this->QueryMod = 0;
  this->QueryToggleMod = 1;
  this->HorizontalMod = 4;
  this->VerticalMod = 2;
  return;
}

Assistant:

ImPlotInputMap::ImPlotInputMap() {
    PanButton             = ImGuiMouseButton_Left;
    PanMod                = ImGuiKeyModFlags_None;
    FitButton             = ImGuiMouseButton_Left;
    ContextMenuButton     = ImGuiMouseButton_Right;
    BoxSelectButton       = ImGuiMouseButton_Right;
    BoxSelectMod          = ImGuiKeyModFlags_None;
    BoxSelectCancelButton = ImGuiMouseButton_Left;
    QueryButton           = ImGuiMouseButton_Middle;
    QueryMod              = ImGuiKeyModFlags_None;
    QueryToggleMod        = ImGuiKeyModFlags_Ctrl;
    HorizontalMod         = ImGuiKeyModFlags_Alt;
    VerticalMod           = ImGuiKeyModFlags_Shift;
}